

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_image_writer.cpp
# Opt level: O0

ssize_t __thiscall PgmImageWriter::write(PgmImageWriter *this,int __fd,void *__buf,size_t __n)

{
  Image *pIVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  undefined4 in_register_00000034;
  uint local_44;
  string local_40 [4];
  int y;
  Image *local_20;
  Image *image_local;
  Stream *stream_local;
  PgmImageWriter *this_local;
  
  local_20 = (Image *)__buf;
  image_local = (Image *)CONCAT44(in_register_00000034,__fd);
  stream_local = (Stream *)this;
  uVar2 = dpfb::Image::getWidth((Image *)__buf);
  uVar3 = dpfb::Image::getHeight(local_20);
  dpfb::str::format_abi_cxx11_((char *)local_40,"P5\n%i %i\n255\n",(ulong)uVar2,(ulong)uVar3);
  dpfb::streams::Stream::writeStr((Stream *)CONCAT44(in_register_00000034,__fd),local_40);
  std::__cxx11::string::~string((string *)local_40);
  local_44 = 0;
  while( true ) {
    iVar4 = dpfb::Image::getHeight(local_20);
    pIVar1 = image_local;
    if (iVar4 <= (int)local_44) break;
    puVar6 = dpfb::Image::getData(local_20);
    iVar4 = dpfb::Image::getPitch(local_20);
    iVar5 = dpfb::Image::getWidth(local_20);
    (**(code **)(*(long *)pIVar1 + 0x18))(pIVar1,puVar6 + (int)(local_44 * iVar4),(long)iVar5);
    local_44 = local_44 + 1;
  }
  return (ulong)local_44;
}

Assistant:

void PgmImageWriter::write(
    dpfb::streams::Stream& stream, const dpfb::Image& image) const
{
    stream.writeStr(
        dpfb::str::format(
            "P5\n%i %i\n255\n",
            image.getWidth(), image.getHeight()));
    for (int y = 0; y < image.getHeight(); ++y)
        stream.writeBuffer(
            image.getData() + y * image.getPitch(), image.getWidth());
}